

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::handleSignal(int sig)

{
  long lVar1;
  int iVar2;
  long lVar3;
  IMutableContext *pIVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *__s;
  
  __s = "<unknown signal>";
  lVar1 = 0;
  do {
    lVar3 = lVar1;
    if (lVar3 == 0x60) goto LAB_00177f1a;
    lVar1 = lVar3 + 0x10;
  } while (*(int *)((long)&signalDefs + lVar3) != sig);
  __s = *(char **)((long)&PTR_anon_var_dwarf_9b2cd_001da0d8 + lVar3);
LAB_00177f1a:
  restorePreviousSignalHandlers();
  pIVar4 = getCurrentMutableContext();
  iVar2 = (*(pIVar4->super_IContext)._vptr_IContext[2])(pIVar4);
  sVar5 = strlen(__s);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x48))
            ((long *)CONCAT44(extraout_var,iVar2),__s,sVar5);
  raise(sig);
  return;
}

Assistant:

static void handleSignal(int sig) {
    char const *name = "<unknown signal>";
    for (auto const &def : signalDefs) {
      if (sig == def.id) {
        name = def.name;
        break;
      }
    }
    // We need to restore previous signal handlers and let them do
    // their thing, so that the users can have the debugger break
    // when a signal is raised, and so on.
    restorePreviousSignalHandlers();
    reportFatal(name);
    raise(sig);
  }